

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O1

void __thiscall
nigel::IMC_Generator::addCmd
          (IMC_Generator *this,HexOp operation,shared_ptr<nigel::IM_Operator> *lOp,
          shared_ptr<nigel::IM_Operator> *rOp)

{
  size_t *psVar1;
  CodeBase *pCVar2;
  undefined8 uVar3;
  _List_node_base *p_Var4;
  undefined1 local_38 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  pCVar2 = this->base;
  local_38._32_8_ = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_10 = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_10->_M_use_count = local_10->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_10->_M_use_count = local_10->_M_use_count + 1;
    }
  }
  local_38._16_8_ = (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_38._24_8_ =
       (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._24_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._24_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._24_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._24_8_)->_M_use_count + 1;
    }
  }
  generateCmd((IMC_Generator *)local_38,operation,
              (shared_ptr<nigel::IM_Operator> *)(local_38 + 0x20),
              (shared_ptr<nigel::IM_Operator> *)(local_38 + 0x10));
  p_Var4 = (_List_node_base *)operator_new(0x20);
  uVar3 = local_38._8_8_;
  p_Var4[1]._M_next = (_List_node_base *)local_38._0_8_;
  p_Var4[1]._M_prev = (_List_node_base *)0x0;
  local_38._8_8_ = (_List_node_base *)0x0;
  p_Var4[1]._M_prev = (_List_node_base *)uVar3;
  local_38._0_8_ = (_func_int **)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pCVar2->imCommands).
            super__List_base<std::shared_ptr<nigel::IM_Command>,_std::allocator<std::shared_ptr<nigel::IM_Command>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._24_8_);
  }
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
  }
  return;
}

Assistant:

void IMC_Generator::addCmd( HexOp operation, std::shared_ptr<IM_Operator> lOp, std::shared_ptr<IM_Operator> rOp )
	{
		base->imCommands.push_back( generateCmd( operation, lOp, rOp ) );
	}